

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

void __thiscall duckdb::DatabaseInstance::DatabaseInstance(DatabaseInstance *this)

{
  (this->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
  super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
  super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  DBConfig::DBConfig(&this->config);
  (this->object_cache).
  super_unique_ptr<duckdb::ObjectCache,_std::default_delete<duckdb::ObjectCache>_>._M_t.
  super___uniq_ptr_impl<duckdb::ObjectCache,_std::default_delete<duckdb::ObjectCache>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ObjectCache_*,_std::default_delete<duckdb::ObjectCache>_>.
  super__Head_base<0UL,_duckdb::ObjectCache_*,_false>._M_head_impl = (ObjectCache *)0x0;
  (this->connection_manager).
  super_unique_ptr<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ConnectionManager_*,_std::default_delete<duckdb::ConnectionManager>_>
  .super__Head_base<0UL,_duckdb::ConnectionManager_*,_false>._M_head_impl = (ConnectionManager *)0x0
  ;
  (this->db_manager).
  super_unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::DatabaseManager_*,_std::default_delete<duckdb::DatabaseManager>_>.
  super__Head_base<0UL,_duckdb::DatabaseManager_*,_false>._M_head_impl = (DatabaseManager *)0x0;
  (this->scheduler).
  super_unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_>._M_t.
  super___uniq_ptr_impl<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TaskScheduler_*,_std::default_delete<duckdb::TaskScheduler>_>.
  super__Head_base<0UL,_duckdb::TaskScheduler_*,_false>._M_head_impl = (TaskScheduler *)0x0;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::BufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::BufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->loaded_extensions_info)._M_h._M_buckets =
       &(this->loaded_extensions_info)._M_h._M_single_bucket;
  (this->loaded_extensions_info)._M_h._M_bucket_count = 1;
  (this->loaded_extensions_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->loaded_extensions_info)._M_h._M_element_count = 0;
  (this->loaded_extensions_info)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->loaded_extensions_info)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->loaded_extensions_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ValidChecker::ValidChecker(&this->db_validity);
  (this->config).is_user_config = false;
  (this->db_file_system).
  super_unique_ptr<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::DatabaseFileSystem_*,_std::default_delete<duckdb::DatabaseFileSystem>_>
  .super__Head_base<0UL,_duckdb::DatabaseFileSystem_*,_false>._M_head_impl =
       (DatabaseFileSystem *)0x0;
  (this->log_manager).internal.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->log_manager).internal.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->external_file_cache).
  super_unique_ptr<duckdb::ExternalFileCache,_std::default_delete<duckdb::ExternalFileCache>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExternalFileCache,_std::default_delete<duckdb::ExternalFileCache>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExternalFileCache_*,_std::default_delete<duckdb::ExternalFileCache>_>
  .super__Head_base<0UL,_duckdb::ExternalFileCache_*,_false>._M_head_impl = (ExternalFileCache *)0x0
  ;
  this->create_api_v1 = (_func_duckdb_ext_api_v1 *)0x0;
  return;
}

Assistant:

DatabaseInstance::DatabaseInstance() {
	config.is_user_config = false;
	create_api_v1 = nullptr;
}